

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O1

void Int_ManResize(Int_Man_t *p)

{
  int iVar1;
  lit *plVar2;
  char *pcVar3;
  int *piVar4;
  Sto_Cls_t **ppSVar5;
  uint *puVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  
  iVar7 = p->pCnf->nVars;
  if (p->nVarsAlloc < iVar7) {
    if (p->nVarsAlloc == 0) {
      p->nVarsAlloc = 1;
    }
    iVar1 = p->nVarsAlloc;
    if (iVar1 < iVar7) {
      do {
        iVar1 = iVar1 * 2;
      } while (iVar1 < iVar7);
      p->nVarsAlloc = iVar1;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar2 = (lit *)malloc((long)iVar1 << 2);
    }
    else {
      plVar2 = (lit *)realloc(p->pTrail,(long)iVar1 << 2);
    }
    p->pTrail = plVar2;
    sVar8 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar2 = (lit *)malloc(sVar8);
    }
    else {
      plVar2 = (lit *)realloc(p->pAssigns,sVar8);
    }
    p->pAssigns = plVar2;
    if (p->pSeens == (char *)0x0) {
      pcVar3 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar3 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar3;
    sVar8 = (long)p->nVarsAlloc << 2;
    if (p->pVarTypes == (int *)0x0) {
      piVar4 = (int *)malloc(sVar8);
    }
    else {
      piVar4 = (int *)realloc(p->pVarTypes,sVar8);
    }
    p->pVarTypes = piVar4;
    sVar8 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar8);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pReasons,sVar8);
    }
    p->pReasons = ppSVar5;
    sVar8 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar8);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pWatches,sVar8);
    }
    p->pWatches = ppSVar5;
  }
  memset(p->pAssigns,0xff,(long)p->pCnf->nVars << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pVarTypes,0,(long)p->pCnf->nVars << 2);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  iVar1 = Int_ManGlobalVars(p);
  p->nVarsAB = iVar1;
  iVar7 = 1 << ((char)iVar1 - 5U & 0x1f);
  if (iVar1 < 6) {
    iVar7 = 1;
  }
  p->nWords = iVar7;
  iVar7 = p->pCnf->nClauses;
  if (p->nClosAlloc < iVar7) {
    if (p->nClosAlloc == 0) {
      p->nClosAlloc = 1;
    }
    iVar1 = p->nClosAlloc;
    if (iVar1 < iVar7) {
      do {
        iVar1 = iVar1 * 2;
      } while (iVar1 < iVar7);
      p->nClosAlloc = iVar1;
    }
    if (p->pProofNums == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(p->pProofNums,(long)iVar1 << 2);
    }
    p->pProofNums = piVar4;
  }
  memset(p->pProofNums,0,(long)p->pCnf->nClauses << 2);
  lVar9 = (long)p->pCnf->nClauses * (long)p->nWords;
  iVar7 = (int)lVar9;
  if (p->nIntersAlloc < iVar7) {
    p->nIntersAlloc = iVar7;
    sVar8 = lVar9 * 4;
    if (p->pInters == (uint *)0x0) {
      puVar6 = (uint *)malloc(sVar8);
    }
    else {
      puVar6 = (uint *)realloc(p->pInters,sVar8);
    }
    p->pInters = puVar6;
  }
  return;
}

Assistant:

void Int_ManResize( Int_Man_t * p )
{
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // compute the number of common variables
    p->nVarsAB = Int_ManGlobalVars( p );
    // compute the number of words in the truth table
    p->nWords = (p->nVarsAB <= 5 ? 1 : (1 << (p->nVarsAB - 5)));

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC(int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );

    // check if resizing of truth tables is needed
    if ( p->nIntersAlloc < p->nWords * p->pCnf->nClauses )
    {
        p->nIntersAlloc = p->nWords * p->pCnf->nClauses;
        p->pInters = ABC_REALLOC(unsigned, p->pInters, p->nIntersAlloc );
    }
//    memset( p->pInters, 0, sizeof(unsigned) * p->nWords * p->pCnf->nClauses );
}